

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Warn.cpp
# Opt level: O2

void __thiscall
WarnGameCommand::trigger
          (WarnGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  uint __val;
  PlayerInfo *pPVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  Config *this_00;
  undefined8 uVar5;
  string_view in_key;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar6;
  string local_b0;
  PlayerInfo *local_90;
  char *local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_b0._M_string_length = (size_type)parameters._M_str;
  local_b0._M_dataplus._M_p = (pointer)parameters._M_len;
  local_40._M_len = 2;
  local_40._M_str = " \t";
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&parameters_split,(basic_string_view<char,_std::char_traits<char>_> *)&local_b0,
             &local_40);
  if (parameters_split.second._M_len == 0) {
    RenX::Server::sendMessage
              (source,player,0x39,"Error: Too few parameters. Syntax: Warn <Player> <Reason>");
  }
  else {
    lVar3 = RenX::Server::getPlayerByPartName
                      (source,parameters_split.first._M_len,parameters_split.first._M_str);
    if (lVar3 != 0) {
      local_88 = parameters_split.second._M_str;
      local_90 = player;
      puVar4 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
      this_00 = (Config *)Jupiter::Config::operator[](lVar3 + 0x1b8,puVar4[1],*puVar4);
      in_key._M_str = "w";
      in_key._M_len = 1;
      iVar2 = Jupiter::Config::get<int>(this_00,in_key,0);
      __val = iVar2 + 1;
      if (iVar2 < pluginInstance.m_maxWarns) {
        puVar4 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
        uVar5 = Jupiter::Config::operator[](lVar3 + 0x1b8,puVar4[1],*puVar4);
        std::__cxx11::to_string(&local_60,__val);
        Jupiter::Config::set(uVar5,1,"w",&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        pPVar1 = local_90;
        string_printf_abi_cxx11_
                  (&local_b0,"You have been warned by %.*s for: %.*s. You have %d warnings.",
                   (local_90->name)._M_string_length,(local_90->name)._M_dataplus._M_p,
                   parameters_split.second._M_len,local_88,CONCAT44(uVar6,__val));
        RenX::Server::sendWarnMessage
                  (source,lVar3,local_b0._M_string_length,local_b0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_b0);
        string_printf_abi_cxx11_
                  (&local_b0,"%.*s has been warned; they now have %d warnings.",
                   *(undefined8 *)(lVar3 + 0x10),*(undefined8 *)(lVar3 + 8),(ulong)__val);
        RenX::Server::sendMessage(source,pPVar1,local_b0._M_string_length,local_b0._M_dataplus._M_p)
        ;
      }
      else if (pluginInstance.m_warnAction == -1) {
        string_printf_abi_cxx11_(&local_b0,"Warning limit reached (%d warnings)",(ulong)__val);
        RenX::Server::kickPlayer(source,lVar3,local_b0._M_string_length,local_b0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_b0);
        string_printf_abi_cxx11_
                  (&local_b0,
                   "%.*s has been kicked from the server for exceeding the warning limit (%d warnings)."
                   ,*(undefined8 *)(lVar3 + 0x10),*(undefined8 *)(lVar3 + 8),(ulong)__val);
        RenX::Server::sendMessage
                  (source,local_90,local_b0._M_string_length,local_b0._M_dataplus._M_p);
      }
      else {
        string_printf_abi_cxx11_(&local_b0,"Warning limit reached (%d warnings)",(ulong)__val);
        RenX::Server::banPlayer
                  (source,lVar3,0x15,"Jupiter Bot/RenX.Warn",local_b0._M_string_length,
                   local_b0._M_dataplus._M_p,(long)pluginInstance.m_warnAction);
        std::__cxx11::string::~string((string *)&local_b0);
        string_printf_abi_cxx11_
                  (&local_b0,
                   "%.*s has been banned from the server for exceeding the warning limit (%d warnings)."
                   ,*(undefined8 *)(lVar3 + 0x10),*(undefined8 *)(lVar3 + 8),(ulong)__val);
        RenX::Server::sendMessage
                  (source,local_90,local_b0._M_string_length,local_b0._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  return;
}

Assistant:

void WarnGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!parameters_split.second.empty()) {
		std::string_view name = parameters_split.first;
		std::string_view reason = parameters_split.second;

		RenX::PlayerInfo *target = source->getPlayerByPartName(name);
		if (target != nullptr) {
			int warns = target->varData[pluginInstance.getName()].get<int>(WARNS_KEY) + 1;
			if (warns > pluginInstance.m_maxWarns) {
				switch (pluginInstance.m_warnAction)
				{
				case -1:
					source->kickPlayer(*target, string_printf("Warning limit reached (%d warnings)", warns));
					source->sendMessage(*player, string_printf("%.*s has been kicked from the server for exceeding the warning limit (%d warnings).", target->name.size(), target->name.data(), warns));
					break;
				default:
					source->banPlayer(*target, "Jupiter Bot/RenX.Warn"sv, string_printf("Warning limit reached (%d warnings)", warns), std::chrono::seconds(pluginInstance.m_warnAction));
					source->sendMessage(*player, string_printf("%.*s has been banned from the server for exceeding the warning limit (%d warnings).", target->name.size(), target->name.data(), warns));
					break;
				}
			}
			else {
				target->varData[pluginInstance.getName()].set(WARNS_KEY, std::to_string(warns));
				source->sendWarnMessage(*target, string_printf("You have been warned by %.*s for: %.*s. You have %d warnings.", player->name.size(), player->name.data(), reason.size(), reason.data(), warns));
				source->sendMessage(*player, string_printf("%.*s has been warned; they now have %d warnings.", target->name.size(), target->name.data(), warns));
			}
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: Warn <Player> <Reason>"sv);
}